

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::internalRaise(QMdiAreaPrivate *this,QMdiSubWindow *mdiChild)

{
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  QObject **ppQVar3;
  QWidget *this_00;
  int iVar4;
  QWidget *in_RSI;
  const_iterator cVar5;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *in_RDI;
  long in_FS_OFFSET;
  QObject *object;
  QObjectList *__range2;
  QMdiSubWindow *stackUnderChild;
  QMdiSubWindow *child;
  const_iterator __end2;
  const_iterator __begin2;
  QObjectList children;
  QList<QObject_*> *in_stack_ffffffffffffff88;
  QMdiAreaPrivate *in_stack_ffffffffffffff98;
  QMdiAreaPrivate *this_01;
  QWidget *this_02;
  const_iterator in_stack_ffffffffffffffc8;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = sanityCheck((QMdiSubWindow *)in_RDI,(char *)in_stack_ffffffffffffff88);
  if ((bVar1) &&
     (qVar2 = QList<QPointer<QMdiSubWindow>_>::size
                        ((QList<QPointer<QMdiSubWindow>_> *)(in_RDI + 0x358)), 1 < qVar2)) {
    this_02 = (QWidget *)0x0;
    iVar4 = (int)in_RSI;
    bVar1 = windowStaysOnTop(in_stack_ffffffffffffff98,(QMdiSubWindow *)in_RDI);
    if (!bVar1) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QObject::children((QObject *)0x60eb52);
      QList<QObject_*>::QList((QList<QObject_*> *)in_RDI,in_stack_ffffffffffffff88);
      local_28.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QObject_*>::begin((QList<QObject_*> *)in_RDI);
      o = QList<QObject_*>::end((QList<QObject_*> *)in_RDI);
      while( true ) {
        cVar5 = o;
        in_stack_ffffffffffffffc8 = o;
        bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_28,o);
        iVar4 = (int)cVar5.i;
        if (!bVar1) break;
        ppQVar3 = QList<QObject_*>::const_iterator::operator*(&local_28);
        this_01 = (QMdiAreaPrivate *)*ppQVar3;
        this_00 = &qobject_cast<QMdiSubWindow*>((QObject *)0x60ebec)->super_QWidget;
        if (((this_00 != (QWidget *)0x0) &&
            (bVar1 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::contains<QMdiSubWindow*>
                               (in_RDI,(QMdiSubWindow **)in_stack_ffffffffffffff88), bVar1)) &&
           (bVar1 = QWidget::isHidden((QWidget *)0x60ec1f), !bVar1)) {
          iVar4 = (int)this_00;
          bVar1 = windowStaysOnTop(this_01,(QMdiSubWindow *)in_RDI);
          if (bVar1) {
            if (this_02 == (QWidget *)0x0) {
              QWidget::raise(this_00,iVar4);
              this_02 = this_00;
            }
            else {
              QWidget::stackUnder(this_02,(QWidget *)in_stack_ffffffffffffffc8.i);
              this_02 = this_00;
            }
          }
        }
        QList<QObject_*>::const_iterator::operator++(&local_28);
      }
      QList<QObject_*>::~QList((QList<QObject_*> *)0x60ec80);
    }
    if (this_02 == (QWidget *)0x0) {
      QWidget::raise(in_RSI,iVar4);
    }
    else {
      QWidget::stackUnder(this_02,(QWidget *)in_stack_ffffffffffffffc8.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::internalRaise(QMdiSubWindow *mdiChild) const
{
    if (!sanityCheck(mdiChild, "QMdiArea::internalRaise") || childWindows.size() < 2)
        return;

    QMdiSubWindow *stackUnderChild = nullptr;
    if (!windowStaysOnTop(mdiChild)) {
        const auto children = viewport->children(); // take a copy, as raising/stacking under changes the order
        for (QObject *object : children) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!child->isHidden() && windowStaysOnTop(child)) {
                if (stackUnderChild)
                    child->stackUnder(stackUnderChild);
                else
                    child->raise();
                stackUnderChild = child;
            }
        }
    }

    if (stackUnderChild)
        mdiChild->stackUnder(stackUnderChild);
    else
        mdiChild->raise();
}